

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O0

RegEx * YAML::Exp::PlainScalar(void)

{
  int iVar1;
  RegEx *ex;
  RegEx *in_stack_fffffffffffffec0;
  RegEx *in_stack_fffffffffffffec8;
  REGEX_OP in_stack_fffffffffffffed4;
  string *in_stack_fffffffffffffed8;
  RegEx *in_stack_fffffffffffffee0;
  allocator local_f9;
  string local_f8 [103];
  allocator local_91;
  string local_90 [144];
  
  if (PlainScalar()::e == '\0') {
    iVar1 = __cxa_guard_acquire(&PlainScalar()::e);
    if (iVar1 != 0) {
      ex = BlankOrBreak();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_90,",[]{}#&*!|>\'\"%@`",&local_91);
      RegEx::RegEx(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed4);
      operator|(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f8,"-?:",&local_f9);
      RegEx::RegEx(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed4);
      BlankOrBreak();
      RegEx::RegEx((RegEx *)0xf01f43);
      operator|(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
      YAML::operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
      operator|(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
      operator!(ex);
      RegEx::~RegEx((RegEx *)0xf01fb9);
      RegEx::~RegEx((RegEx *)0xf01fc6);
      RegEx::~RegEx((RegEx *)0xf01fd0);
      RegEx::~RegEx((RegEx *)0xf01fda);
      RegEx::~RegEx((RegEx *)0xf01fe7);
      std::__cxx11::string::~string(local_f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_f9);
      RegEx::~RegEx((RegEx *)0xf02008);
      RegEx::~RegEx((RegEx *)0xf02015);
      std::__cxx11::string::~string(local_90);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
      __cxa_atexit(RegEx::~RegEx,&PlainScalar::e,&__dso_handle);
      __cxa_guard_release(&PlainScalar()::e);
    }
  }
  return &PlainScalar::e;
}

Assistant:

inline const RegEx& PlainScalar() {
  static const RegEx e =
      !(BlankOrBreak() | RegEx(",[]{}#&*!|>\'\"%@`", REGEX_OR) |
        (RegEx("-?:", REGEX_OR) + (BlankOrBreak() | RegEx())));
  return e;
}